

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorText::GenerateElementData(DecoratorText *this,Element *element,BoxArea paint_area)

{
  bool bVar1;
  DecoratorText *element_data;
  undefined8 uVar2;
  undefined8 uVar3;
  Vector<TexturedGeometry> *this_00;
  String local_50;
  DecoratorText *local_30;
  ElementData *data;
  Element *pEStack_20;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorText *this_local;
  
  data._4_4_ = paint_area;
  pEStack_20 = element;
  element_local = (Element *)this;
  element_data = (DecoratorText *)operator_new(0x28);
  *(BoxArea *)&(element_data->super_Decorator)._vptr_Decorator = data._4_4_;
  this_00 = (Vector<TexturedGeometry> *)&(element_data->super_Decorator).first_texture;
  memset(this_00,0,0x18);
  ::std::
  vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
  ::vector(this_00);
  *(undefined4 *)
   &(element_data->super_Decorator).additional_textures.
    super__Vector_base<Rml::Texture,_std::allocator<Rml::Texture>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0xffffffff;
  local_30 = element_data;
  bVar1 = GenerateGeometry(this,pEStack_20,(ElementData *)element_data);
  if (bVar1) {
    this_local = local_30;
  }
  else {
    uVar2 = ::std::__cxx11::string::c_str();
    Element::GetAddress_abi_cxx11_(&local_50,pEStack_20,false,true);
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Could not construct text decorator with text %s on element %s",uVar2,
                 uVar3);
    ::std::__cxx11::string::~string((string *)&local_50);
    this_local = (DecoratorText *)0x0;
  }
  return (DecoratorDataHandle)this_local;
}

Assistant:

DecoratorDataHandle DecoratorText::GenerateElementData(Element* element, BoxArea paint_area) const
{
	ElementData* data = new ElementData{paint_area, {}, -1};

	if (!GenerateGeometry(element, *data))
	{
		Log::Message(Log::LT_WARNING, "Could not construct text decorator with text %s on element %s", text.c_str(), element->GetAddress().c_str());
		return {};
	}

	return reinterpret_cast<DecoratorDataHandle>(data);
}